

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O0

double __thiscall
soplex::SSVectorBase<double>::operator*(SSVectorBase<double> *this,SSVectorBase<double> *w)

{
  int iVar1;
  char *pcVar2;
  reference pvVar3;
  const_reference pvVar4;
  int __c;
  int __c_00;
  int extraout_EDX;
  int __c_01;
  int __c_02;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  SSVectorBase<double> *in_RSI;
  SSVectorBase<double> *in_RDI;
  double dVar5;
  int wj;
  int vi;
  int j;
  int i;
  StableSum<double> x;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  int local_30;
  int local_2c;
  uint local_28;
  uint local_24;
  StableSum<double> local_20;
  SSVectorBase<double> *local_10;
  
  local_10 = in_RSI;
  setup((SSVectorBase<double> *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  StableSum<double>::StableSum(&local_20);
  iVar1 = size((SSVectorBase<double> *)0x2a0541);
  local_24 = iVar1 - 1;
  iVar1 = size((SSVectorBase<double> *)0x2a0552);
  local_28 = iVar1 - 1;
  if ((-1 < (int)local_24) && (-1 < (int)local_28)) {
    pcVar2 = index(in_RDI,(char *)(ulong)local_24,__c);
    local_2c = (int)pcVar2;
    pcVar2 = index(local_10,(char *)(ulong)local_28,__c_00);
    local_30 = (int)pcVar2;
    iVar1 = extraout_EDX;
    while (local_24 != 0 && local_28 != 0) {
      if (local_2c == local_30) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&(in_RDI->super_VectorBase<double>).val,(long)local_2c);
        dVar5 = *pvVar3;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&(local_10->super_VectorBase<double>).val,(long)local_30);
        StableSum<double>::operator+=(&local_20,dVar5 * *pvVar4);
        local_24 = local_24 - 1;
        pcVar2 = index(in_RDI,(char *)(ulong)local_24,__c_01);
        local_2c = (int)pcVar2;
        local_28 = local_28 - 1;
        pcVar2 = index(local_10,(char *)(ulong)local_28,__c_02);
        local_30 = (int)pcVar2;
        iVar1 = extraout_EDX_00;
      }
      else if (local_30 < local_2c) {
        local_24 = local_24 - 1;
        pcVar2 = index(in_RDI,(char *)(ulong)local_24,iVar1);
        local_2c = (int)pcVar2;
        iVar1 = extraout_EDX_01;
      }
      else {
        local_28 = local_28 - 1;
        pcVar2 = index(local_10,(char *)(ulong)local_28,iVar1);
        local_30 = (int)pcVar2;
        iVar1 = extraout_EDX_02;
      }
    }
    while (local_24 != 0 && local_2c != local_30) {
      local_24 = local_24 - 1;
      pcVar2 = index(in_RDI,(char *)(ulong)local_24,iVar1);
      iVar1 = extraout_EDX_03;
      local_2c = (int)pcVar2;
    }
    while (local_28 != 0 && local_2c != local_30) {
      local_28 = local_28 - 1;
      pcVar2 = index(local_10,(char *)(ulong)local_28,iVar1);
      iVar1 = extraout_EDX_04;
      local_30 = (int)pcVar2;
    }
    if (local_2c == local_30) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(in_RDI->super_VectorBase<double>).val,(long)local_2c);
      dVar5 = *pvVar3;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(local_10->super_VectorBase<double>).val,(long)local_30);
      StableSum<double>::operator+=(&local_20,dVar5 * *pvVar4);
    }
  }
  dVar5 = StableSum::operator_cast_to_double((StableSum *)&local_20);
  return dVar5;
}

Assistant:

R operator*(const SSVectorBase<S>& w)
   {
      setup();

      StableSum<R> x;
      int i = size() - 1;
      int j = w.size() - 1;

      // both *this and w non-zero vectors?
      if(i >= 0 && j >= 0)
      {
         int vi = index(i);
         int wj = w.index(j);

         while(i != 0 && j != 0)
         {
            if(vi == wj)
            {
               x += VectorBase<R>::val[vi] * R(w.val[wj]);
               vi = index(--i);
               wj = w.index(--j);
            }
            else if(vi > wj)
               vi = index(--i);
            else
               wj = w.index(--j);
         }

         /* check remaining indices */

         while(i != 0 && vi != wj)
            vi = index(--i);

         while(j != 0 && vi != wj)
            wj = w.index(--j);

         if(vi == wj)
            x += VectorBase<R>::val[vi] * R(w.val[wj]);
      }

      return x;
   }